

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O0

uint32_t __thiscall llvm::DWARFDebugAranges::findAddress(DWARFDebugAranges *this,uint64_t Address)

{
  bool bVar1;
  bool bVar2;
  pointer pRVar3;
  __normal_iterator<const_llvm::DWARFDebugAranges::Range_*,_std::vector<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>_>
  local_38;
  uint64_t local_30;
  __normal_iterator<const_llvm::DWARFDebugAranges::Range_*,_std::vector<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>_>
  local_28;
  RangeCollIterator It;
  uint64_t Address_local;
  DWARFDebugAranges *this_local;
  
  local_30 = Address;
  It._M_current = (Range *)Address;
  local_28._M_current =
       (Range *)partition_point<std::vector<llvm::DWARFDebugAranges::Range,std::allocator<llvm::DWARFDebugAranges::Range>>const&,llvm::DWARFDebugAranges::findAddress(unsigned_long)const::__0,llvm::DWARFDebugAranges::Range_const&>
                          (&this->Aranges,(anon_class_8_1_a22a66b4)Address);
  local_38._M_current =
       (Range *)std::
                vector<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>
                ::end(&this->Aranges);
  bVar2 = __gnu_cxx::operator!=(&local_28,&local_38);
  bVar1 = false;
  if (bVar2) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFDebugAranges::Range_*,_std::vector<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>_>
             ::operator->(&local_28);
    bVar1 = (Range *)pRVar3->LowPC <= It._M_current;
  }
  if (bVar1) {
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_llvm::DWARFDebugAranges::Range_*,_std::vector<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>_>
             ::operator->(&local_28);
    this_local._4_4_ = pRVar3->CUOffset;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t DWARFDebugAranges::findAddress(uint64_t Address) const {
  RangeCollIterator It =
      partition_point(Aranges, [=](Range R) { return R.HighPC() <= Address; });
  if (It != Aranges.end() && It->LowPC <= Address)
    return It->CUOffset;
  return -1U;
}